

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

wstring * __thiscall
Centaurus::NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_entry_wide
          (wstring *__return_storage_ptr__,
          NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> *this,wstring *prefix)

{
  pointer pwVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pwVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)__return_storage_ptr__,pwVar1,pwVar1 + prefix->_M_string_length);
  std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::wstring get_entry_wide(const std::wstring& prefix) const
	{
		return prefix + L"_S0";
	}